

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.hpp
# Opt level: O2

void __thiscall
ot::commissioner::DtlsSession::DtlsTimer::DtlsTimer
          (DtlsTimer *this,event_base *aEventBase,Action *aAction)

{
  function<void_(ot::commissioner::Timer_&)> fStack_38;
  
  std::function<void_(ot::commissioner::Timer_&)>::function(&fStack_38,aAction);
  Timer::Timer(&this->super_Timer,aEventBase,&fStack_38,true);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  (this->mIntermediate).__d.__r = 0;
  this->mCancelled = false;
  return;
}

Assistant:

DtlsTimer(struct event_base *aEventBase, Action aAction)
            : Timer(aEventBase, aAction)
            , mCancelled(false)
        {
        }